

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void anon_unknown.dwarf_f6a4::usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(stream,"Usage: ");
  poVar1 = std::operator<<(poVar1,program_name);
  poVar1 = std::operator<<(poVar1," [options] infile outfile");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<(stream,
                    "\nRead an OpenEXR image from infile, produce a tiled\nversion of the image, and save the result in outfile.\n\nOptions:\n\n  -o            produces a ONE_LEVEL image (default)\n\n  -m            produces a MIPMAP_LEVELS multiresolution image\n\n  -r            produces a RIPMAP_LEVELS multiresolution image\n\n  -f c          when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n                is produced, image channel c will be resampled\n                without low-pass filtering.  This option can\n                be specified multiple times to disable low-pass\n                filtering for multiple channels.\n\n  -e x y        when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n                is produced, low-pass filtering takes samples\n                outside the image\'s data window.  This requires\n                extrapolating the image.  Option -e specifies\n                how the image is extrapolated horizontally and\n                vertically (black/clamp/periodic/mirror, default\n                is clamp).\n\n  -t x y        sets the tile size in the output image to\n                x by y pixels (default is 64 by 64)\n\n  -d            sets level size rounding to ROUND_DOWN (default)\n\n  -u            sets level size rounding to ROUND_UP\n\n  -z x          sets the data compression method to x\n                (none/rle/zip/piz/pxr24/b44/b44a/dwaa/dwab,\n                default is zip)\n\n  -v            verbose mode\n\n  -h, --help    print this message\n\n      --version print version information\n\nMultipart Options:\n\n  -p i          part number, default is 0\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
    {
        stream << "\n"
            "Read an OpenEXR image from infile, produce a tiled\n"
            "version of the image, and save the result in outfile.\n"
            "\n"
            "Options:\n"
            "\n"
            "  -o            produces a ONE_LEVEL image (default)\n"
            "\n"
            "  -m            produces a MIPMAP_LEVELS multiresolution image\n"
            "\n"
            "  -r            produces a RIPMAP_LEVELS multiresolution image\n"
            "\n"
            "  -f c          when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n"
            "                is produced, image channel c will be resampled\n"
            "                without low-pass filtering.  This option can\n"
            "                be specified multiple times to disable low-pass\n"
            "                filtering for multiple channels.\n"
            "\n"
            "  -e x y        when a MIPMAP_LEVELS or RIPMAP_LEVELS image\n"
            "                is produced, low-pass filtering takes samples\n"
            "                outside the image's data window.  This requires\n"
            "                extrapolating the image.  Option -e specifies\n"
            "                how the image is extrapolated horizontally and\n"
            "                vertically (black/clamp/periodic/mirror, default\n"
            "                is clamp).\n"
            "\n"
            "  -t x y        sets the tile size in the output image to\n"
            "                x by y pixels (default is 64 by 64)\n"
            "\n"
            "  -d            sets level size rounding to ROUND_DOWN (default)\n"
            "\n"
            "  -u            sets level size rounding to ROUND_UP\n"
            "\n"
            "  -z x          sets the data compression method to x\n"
            "                (none/rle/zip/piz/pxr24/b44/b44a/dwaa/dwab,\n"
            "                default is zip)\n"
            "\n"
            "  -v            verbose mode\n"
             "\n"
            "  -h, --help    print this message\n"
            "\n"
            "      --version print version information\n"
            "\n"
            "Multipart Options:\n"
            "\n"
            "  -p i          part number, default is 0\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
    }
}